

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_relation_set.cpp
# Opt level: O2

JoinRelationSet * __thiscall
duckdb::JoinRelationSetManager::Union
          (JoinRelationSetManager *this,JoinRelationSet *left,JoinRelationSet *right)

{
  _Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_> _Var1;
  _Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_> _Var2;
  ulong uVar3;
  ulong uVar4;
  JoinRelationSet *pJVar5;
  ulong uVar6;
  idx_t count;
  ulong uVar7;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long>,_false> relations;
  _Head_base<0UL,_unsigned_long_*,_false> local_30;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> local_28;
  
  make_unsafe_uniq_array<unsigned_long>((duckdb *)&local_30,right->count + left->count);
  _Var1.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (left->relations).super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
       _M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
       super__Head_base<0UL,_unsigned_long_*,_false>;
  _Var2.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (right->relations).super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
       _M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
       super__Head_base<0UL,_unsigned_long_*,_false>;
  uVar4 = 0;
  uVar6 = 0;
  count = 0;
  do {
    uVar7 = left->count;
    if (uVar6 == uVar7) {
      _Var1.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (right->relations).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
      for (; uVar4 < right->count; uVar4 = uVar4 + 1) {
        local_30._M_head_impl[count] =
             *(undefined8 *)
              ((long)_Var1.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl + uVar4 * 8);
        count = count + 1;
      }
LAB_0121d6a2:
      local_28._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
           (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)local_30._M_head_impl;
      local_30._M_head_impl = (unsigned_long *)0x0;
      pJVar5 = GetJoinRelation(this,(unsafe_unique_array<idx_t> *)&local_28,count);
      ::std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
                ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)&local_28);
      ::std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
                ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)&local_30);
      return pJVar5;
    }
    if (uVar4 == right->count) {
      _Var1.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (left->relations).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
      for (; uVar6 < uVar7; uVar6 = uVar6 + 1) {
        local_30._M_head_impl[count] =
             *(undefined8 *)
              ((long)_Var1.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl + uVar6 * 8);
        count = count + 1;
        uVar7 = left->count;
      }
      goto LAB_0121d6a2;
    }
    uVar7 = *(ulong *)((long)_Var1.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl +
                      uVar6 * 8);
    uVar3 = *(ulong *)((long)_Var2.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl +
                      uVar4 * 8);
    if (uVar7 < uVar3) {
      local_30._M_head_impl[count] = uVar7;
      uVar6 = uVar6 + 1;
    }
    else {
      if (uVar3 < uVar7) {
        local_30._M_head_impl[count] = uVar3;
      }
      else {
        local_30._M_head_impl[count] = uVar7;
        uVar6 = uVar6 + 1;
      }
      uVar4 = uVar4 + 1;
    }
    count = count + 1;
  } while( true );
}

Assistant:

JoinRelationSet &JoinRelationSetManager::Union(JoinRelationSet &left, JoinRelationSet &right) {
	auto relations = make_unsafe_uniq_array<idx_t>(left.count + right.count);
	idx_t count = 0;
	// move through the left and right relations, eliminating duplicates
	idx_t i = 0, j = 0;
	while (true) {
		if (i == left.count) {
			// exhausted left relation, add remaining of right relation
			for (; j < right.count; j++) {
				relations[count++] = right.relations[j];
			}
			break;
		} else if (j == right.count) {
			// exhausted right relation, add remaining of left
			for (; i < left.count; i++) {
				relations[count++] = left.relations[i];
			}
			break;
		} else if (left.relations[i] < right.relations[j]) {
			// left is smaller, progress left and add it to the set
			relations[count++] = left.relations[i];
			i++;
		} else if (left.relations[i] > right.relations[j]) {
			// right is smaller, progress right and add it to the set
			relations[count++] = right.relations[j];
			j++;
		} else {
			D_ASSERT(left.relations[i] == right.relations[j]);
			relations[count++] = left.relations[i];
			i++;
			j++;
		}
	}
	return GetJoinRelation(std::move(relations), count);
}